

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

void __thiscall
TiXmlDocument::SetError
          (TiXmlDocument *this,int err,char *pError,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  char *__s;
  size_t len;
  
  if (this->error == false) {
    if (0xe < err - 1U) {
      __assert_fail("err > 0 && err < TIXML_ERROR_STRING_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/luckynote[P]ibug_300W_make_landmarks_tools/src/tinyXML/tinyxmlparser.cpp"
                    ,0x324,
                    "void TiXmlDocument::SetError(int, const char *, TiXmlParsingData *, TiXmlEncoding)"
                   );
    }
    this->error = true;
    this->errorId = err;
    __s = TiXmlBase::errorString[(uint)err];
    len = strlen(__s);
    TiXmlString::assign(&this->errorDesc,__s,len);
    (this->errorLocation).row = -1;
    (this->errorLocation).col = -1;
    if (data != (TiXmlParsingData *)0x0 && pError != (char *)0x0) {
      TiXmlParsingData::Stamp(data,pError,encoding);
      this->errorLocation = data->cursor;
    }
  }
  return;
}

Assistant:

void TiXmlDocument::SetError( int err, const char* pError, TiXmlParsingData* data, TiXmlEncoding encoding )
{	
	// The first error in a chain is more accurate - don't set again!
	if ( error )
		return;

	assert( err > 0 && err < TIXML_ERROR_STRING_COUNT );
	error   = true;
	errorId = err;
	errorDesc = errorString[ errorId ];

	errorLocation.Clear();
	if ( pError && data )
	{
		data->Stamp( pError, encoding );
		errorLocation = data->Cursor();
	}
}